

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDElementDecl.cpp
# Opt level: O3

XMLCh * __thiscall xercesc_4_0::DTDElementDecl::formatContentModel(DTDElementDecl *this)

{
  short *psVar1;
  MemoryManager *pMVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  XMLCh *pXVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  size_t sVar5;
  undefined2 *__src;
  XMLBuffer bufFmt;
  XMLBuffer local_50;
  void *__dest;
  
  iVar3 = *(int *)&(this->super_XMLElementDecl).field_0x2c;
  if (iVar3 == 0) {
    pMVar2 = (this->super_XMLElementDecl).fMemoryManager;
    sVar5 = 0;
    do {
      psVar1 = (short *)((long)&XMLUni::fgEmptyString + sVar5);
      sVar5 = sVar5 + 2;
    } while (*psVar1 != 0);
    iVar3 = (*pMVar2->_vptr_MemoryManager[3])(pMVar2,sVar5);
    __dest = (void *)CONCAT44(extraout_var_00,iVar3);
    __src = &XMLUni::fgEmptyString;
  }
  else {
    if (iVar3 != 1) {
      local_50.fMemoryManager = (this->super_XMLElementDecl).fMemoryManager;
      local_50.fIndex = 0;
      local_50.fCapacity = 0x3ff;
      local_50.fFullSize = 0;
      local_50.fUsed = false;
      local_50.fFullHandler = (XMLBufferFullHandler *)0x0;
      iVar3 = (*(local_50.fMemoryManager)->_vptr_MemoryManager[3])(local_50.fMemoryManager,0x800);
      local_50.fBuffer = (XMLCh *)CONCAT44(extraout_var_01,iVar3);
      *local_50.fBuffer = L'\0';
      iVar3 = (*(this->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[8])(this);
      ContentSpecNode::formatSpec((ContentSpecNode *)CONCAT44(extraout_var_02,iVar3),&local_50);
      pXVar4 = local_50.fBuffer;
      local_50.fBuffer[local_50.fIndex] = L'\0';
      pMVar2 = (this->super_XMLElementDecl).fMemoryManager;
      sVar5 = 0;
      do {
        psVar1 = (short *)((long)local_50.fBuffer + sVar5);
        sVar5 = sVar5 + 2;
      } while (*psVar1 != 0);
      iVar3 = (*pMVar2->_vptr_MemoryManager[3])(pMVar2,sVar5);
      memcpy((XMLCh *)CONCAT44(extraout_var_03,iVar3),pXVar4,sVar5);
      (*(local_50.fMemoryManager)->_vptr_MemoryManager[4])(local_50.fMemoryManager,local_50.fBuffer)
      ;
      return (XMLCh *)CONCAT44(extraout_var_03,iVar3);
    }
    pMVar2 = (this->super_XMLElementDecl).fMemoryManager;
    sVar5 = 0;
    do {
      psVar1 = (short *)((long)&XMLUni::fgAnyString + sVar5);
      sVar5 = sVar5 + 2;
    } while (*psVar1 != 0);
    iVar3 = (*pMVar2->_vptr_MemoryManager[3])(pMVar2,sVar5);
    __dest = (void *)CONCAT44(extraout_var,iVar3);
    __src = &XMLUni::fgAnyString;
  }
  pXVar4 = (XMLCh *)memcpy(__dest,__src,sVar5);
  return pXVar4;
}

Assistant:

XMLCh* DTDElementDecl::formatContentModel() const
{
    XMLCh* newValue = 0;
    if (fModelType == Any)
    {
        newValue = XMLString::replicate(XMLUni::fgAnyString, getMemoryManager());
    }
     else if (fModelType == Empty)
    {
        newValue = XMLString::replicate(XMLUni::fgEmptyString, getMemoryManager());
    }
     else
    {
        //
        //  Use a temp XML buffer to format into. Content models could be
        //  pretty long, but very few will be longer than one K. The buffer
        //  will expand to handle the more pathological ones.
        //
        XMLBuffer bufFmt(1023, getMemoryManager());
        getContentSpec()->formatSpec(bufFmt);
        newValue = XMLString::replicate(bufFmt.getRawBuffer(), getMemoryManager());
    }
    return newValue;
}